

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Neighbor_alltoall
              (void *sendbuf,int sendcount,MPIABI_Datatype senddtype,void *recvbuf,int recvcount,
              MPIABI_Datatype recvtype,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Neighbor_alltoall();
  return iVar1;
}

Assistant:

int MPIABI_Neighbor_alltoall(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype senddtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm
) {
  return MPI_Neighbor_alltoall(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)senddtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm
  );
}